

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-ir.cc
# Opt level: O1

Result __thiscall
wabt::anon_unknown_67::BinaryReaderIR::OnStartFunction(BinaryReaderIR *this,Index func_index)

{
  char *pcVar1;
  Offset OVar2;
  Module *this_00;
  size_t sVar3;
  undefined1 local_a0 [8];
  Var start;
  Location loc;
  
  if ((ulong)func_index <
      (ulong)((long)(this->module_->funcs).
                    super__Vector_base<wabt::Func_*,_std::allocator<wabt::Func_*>_>._M_impl.
                    super__Vector_impl_data._M_finish -
              (long)(this->module_->funcs).
                    super__Vector_base<wabt::Func_*,_std::allocator<wabt::Func_*>_>._M_impl.
                    super__Vector_impl_data._M_start >> 3)) {
    loc.filename.size_._0_4_ = 0;
    loc.filename.size_._4_4_ = 0;
    loc.field_1.field_0.line = 0;
    start.field_2._24_8_ = 0;
    loc.filename.data_._0_4_ = 0;
    loc.filename.data_._4_4_ = 0;
    pcVar1 = this->filename_;
    sVar3 = strlen(pcVar1);
    loc.filename.data_._0_4_ = (undefined4)sVar3;
    loc.filename.data_._4_4_ = (undefined4)(sVar3 >> 0x20);
    OVar2 = ((this->super_BinaryReaderNop).super_BinaryReaderDelegate.state)->offset;
    loc.filename.size_._0_4_ = (undefined4)OVar2;
    loc.filename.size_._4_4_ = (undefined4)(OVar2 >> 0x20);
    start.field_2._24_8_ = pcVar1;
    Var::Var((Var *)local_a0,func_index,(Location *)((long)&start.field_2 + 0x18));
    this_00 = this->module_;
    loc.filename.size_._0_4_ = 0;
    loc.filename.size_._4_4_ = 0;
    loc.field_1.field_0.line = 0;
    start.field_2._24_8_ = 0;
    loc.filename.data_._0_4_ = 0;
    loc.filename.data_._4_4_ = 0;
    pcVar1 = this->filename_;
    sVar3 = strlen(pcVar1);
    loc.filename.data_._0_4_ = (undefined4)sVar3;
    loc.filename.data_._4_4_ = (undefined4)(sVar3 >> 0x20);
    OVar2 = ((this->super_BinaryReaderNop).super_BinaryReaderDelegate.state)->offset;
    loc.filename.size_._0_4_ = (undefined4)OVar2;
    loc.filename.size_._4_4_ = (undefined4)(OVar2 >> 0x20);
    start.field_2._24_8_ = pcVar1;
    MakeUnique<wabt::StartModuleField,wabt::Var&,wabt::Location>
              ((wabt *)(loc.field_1.field2 + 8),(Var *)local_a0,
               (Location *)((long)&start.field_2 + 0x18));
    Module::AppendField(this_00,(unique_ptr<wabt::StartModuleField,_std::default_delete<wabt::StartModuleField>_>
                                 *)((long)&loc.field_1 + 8));
    if (loc.field_1._8_8_ != 0) {
      (**(code **)(*(long *)loc.field_1._8_8_ + 8))();
    }
    loc.field_1._8_8_ = 0;
    Var::~Var((Var *)local_a0);
    return (Result)Ok;
  }
  __assert_fail("func_index < module_->funcs.size()",
                "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/wabt/src/binary-reader-ir.cc"
                ,0x236,
                "virtual Result wabt::(anonymous namespace)::BinaryReaderIR::OnStartFunction(Index)"
               );
}

Assistant:

Result BinaryReaderIR::OnStartFunction(Index func_index) {
  assert(func_index < module_->funcs.size());
  Var start(func_index, GetLocation());
  module_->AppendField(MakeUnique<StartModuleField>(start, GetLocation()));
  return Result::Ok;
}